

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
::swap(btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
       *this,btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  VType *pVVar1;
  template_ElementType<1L> tVar2;
  int iVar3;
  VType VVar4;
  VType VVar5;
  VType VVar6;
  VType VVar7;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
  *this_00;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  template_ElementType<2L> *ptVar14;
  template_ElementType<2L> *ptVar15;
  template_ElementType<3L> *__first1;
  template_ElementType<3L> *ppbVar16;
  template_ElementType<3L> *__first2;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  *pbVar17;
  template_ElementType<0L> *ppbVar18;
  template_ElementType<1L> *ptVar19;
  template_ElementType<1L> *ptVar20;
  long lVar21;
  uint i;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  *this_01;
  
  bVar8 = leaf(this);
  bVar9 = leaf(x);
  if (bVar8 != bVar9) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x6bc,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  bVar10 = count(this);
  bVar11 = count(x);
  this_01 = x;
  this_00 = (btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
             *)this;
  if (bVar11 < bVar10) {
    this_01 = this;
    this_00 = (btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
               *)x;
  }
  ptVar14 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
            ::GetField<2l>(this_00);
  ptVar15 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
            ::GetField<2l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                            *)this_01);
  bVar10 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00);
  for (lVar21 = 0; (ulong)bVar10 * 0x20 != lVar21; lVar21 = lVar21 + 0x20) {
    pVVar1 = (VType *)(lVar21 + (long)ptVar15);
    VVar4 = (ptVar14->value).first.c_[2];
    VVar5 = (ptVar14->value).first.c_[0];
    VVar6 = (ptVar14->value).first.c_[1];
    (ptVar14->value).first.c_[2] = pVVar1[2];
    VVar7 = pVVar1[1];
    (ptVar14->value).first.c_[0] = *pVVar1;
    (ptVar14->value).first.c_[1] = VVar7;
    pVVar1[2] = VVar4;
    *pVVar1 = VVar5;
    pVVar1[1] = VVar6;
    iVar3 = (ptVar14->value).second;
    (ptVar14->value).second = *(int *)(pVVar1 + 3);
    *(int *)(pVVar1 + 3) = iVar3;
    ptVar14 = ptVar14 + 1;
  }
  bVar10 = count(this_01);
  bVar11 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00);
  bVar12 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00);
  bVar13 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00);
  uninitialized_move_n
            (this_01,(ulong)bVar10 - (ulong)bVar11,(ulong)bVar12,(ulong)bVar13,
             (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
              *)this_00,alloc);
  bVar12 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00);
  value_destroy_n(this_01,(ulong)bVar12,(ulong)bVar10 - (ulong)bVar11,alloc);
  bVar8 = leaf(this);
  if (!bVar8) {
    __first1 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
               ::GetField<3l>(this_00);
    bVar10 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                    *)this_00);
    ppbVar16 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
               ::GetField<3l>(this_00);
    __first2 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
               ::GetField<3l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                               *)this_01);
    std::
    swap_ranges<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>**,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>**>
              (__first1,ppbVar16 + (ulong)bVar10 + 1,__first2);
    for (i = 0; bVar10 = count((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                                *)this_00), i <= bVar10; i = i + 1) {
      pbVar17 = child((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                       *)this_00,i);
      ppbVar18 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                 ::GetField<0l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                                 *)pbVar17);
      *ppbVar18 = (template_ElementType<0L>)this_00;
      pbVar17 = child(this_01,i);
      ppbVar18 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                 ::GetField<0l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                                 *)pbVar17);
      *ppbVar18 = this_01;
    }
    for (; bVar10 = count(this_01), i <= bVar10; i = i + 1) {
      pbVar17 = child(this_01,i);
      init_child((btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                  *)this_00,i,pbVar17);
      btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
      ::GetField<3l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                      *)this_01);
    }
  }
  ptVar19 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
            ::GetField<1l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                            *)this);
  ptVar20 = btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
            ::GetField<1l>((btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                            *)x);
  tVar2 = ptVar19[2];
  ptVar19[2] = ptVar20[2];
  ptVar20[2] = tVar2;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
  using std::swap;
  assert(leaf() == x->leaf());

  // Determine which is the smaller/larger node.
  btree_node *smaller = this, *larger = x;
  if (smaller->count() > larger->count()) {
    swap(smaller, larger);
  }

  // Swap the values.
  for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
       a != end; ++a, ++b) {
    slot_type::swap(alloc, a, b);
  }

  // Move values that can't be swapped.
  const size_type to_move = larger->count() - smaller->count();
  larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                               smaller, alloc);
  larger->value_destroy_n(smaller->count(), to_move, alloc);

  if (!leaf()) {
    // Swap the child pointers.
    std::swap_ranges(&smaller->mutable_child(0),
                     &smaller->mutable_child(smaller->count() + 1),
                     &larger->mutable_child(0));
    // Update swapped children's parent pointers.
    int i = 0;
    for (; i <= smaller->count(); ++i) {
      smaller->child(i)->set_parent(smaller);
      larger->child(i)->set_parent(larger);
    }
    // Move the child pointers that couldn't be swapped.
    for (; i <= larger->count(); ++i) {
      smaller->init_child(i, larger->child(i));
      larger->clear_child(i);
    }
  }

  // Swap the counts.
  swap(mutable_count(), x->mutable_count());
}